

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::FindPackageStackRAII::FindPackageStackRAII
          (FindPackageStackRAII *this,cmMakefile *mf,string *name)

{
  uint *puVar1;
  __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  string local_40 [32];
  uint local_20;
  
  this->Makefile = mf;
  std::__cxx11::string::string(local_40,(string *)name);
  local_20 = this->Makefile->FindPackageStackNextIndex;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Push
            ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_50,
             (cmFindPackageCall *)&mf->FindPackageStack);
  std::
  __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&this->Makefile->FindPackageStack,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__cxx11::string::~string(local_40);
  puVar1 = &this->Makefile->FindPackageStackNextIndex;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

cmMakefile::FindPackageStackRAII::FindPackageStackRAII(cmMakefile* mf,
                                                       std::string const& name)
  : Makefile(mf)
{
  this->Makefile->FindPackageStack =
    this->Makefile->FindPackageStack.Push(cmFindPackageCall{
      name,
      this->Makefile->FindPackageStackNextIndex,
    });
  this->Makefile->FindPackageStackNextIndex++;
}